

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

void jsoncons::jsonpointer::
     add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,
               basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  pointer pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *pkVar6;
  uint uVar7;
  jsonpointer_errc __e;
  pointer pbVar8;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this;
  type tVar9;
  array_range_type aVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  size_t index;
  detail *local_80;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_78;
  detail local_70 [16];
  undefined1 local_60 [24];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_48;
  string_view_type local_40;
  
  local_80 = local_70;
  local_78 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)0x0;
  local_70[0] = (detail)0x0;
  pbVar8 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)root;
  if (pbVar8 == pbVar1) {
LAB_0044a7b9:
    while( true ) {
      uVar7 = (byte)*(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)root
              & 0xf;
      if (1 < uVar7 - 8) break;
      root = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)root + 8);
    }
    if (uVar7 == 0xe) {
      if ((local_78 ==
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x1) && (*local_80 == (detail)0x2d)) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        emplace_back<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                  (this,value);
        sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)this);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   this,sVar5 - 1);
        goto LAB_0044a881;
      }
      local_60._0_8_ =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      tVar9 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (local_80,(char *)local_78,(size_t)local_60,(unsigned_long *)(ulong)uVar7);
      uVar2 = local_60._0_8_;
      __e = invalid_index;
      if (tVar9.ec == success) {
        pkVar6 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)this);
        uVar3 = local_60._0_8_;
        __e = index_exceeds_array_size;
        if ((ulong)uVar2 <= pkVar6) {
          pkVar6 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                      size((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)this);
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *)uVar3 == pkVar6) {
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            emplace_back<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      (this,value);
            sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)this);
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this,sVar5 - 1);
          }
          else {
            aVar10 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                     array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                  *)this);
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            insert<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                      (this,aVar10.first_._M_current._M_current + local_60._0_8_,value);
          }
          goto LAB_0044a881;
        }
      }
    }
    else {
      bVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)this);
      if (bVar4) {
        local_40._M_len = (size_t)local_78;
        local_40._M_str = (char *)local_80;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_60,this,&local_40,value);
        goto LAB_0044a881;
      }
      __e = expected_object_or_array;
    }
    std::error_code::operator=(ec,__e);
  }
  else {
    local_48 = value;
    do {
      std::__cxx11::string::_M_assign((string *)&local_80);
      pbVar8 = pbVar8 + 1;
      value = local_48;
      this = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)root;
      if (pbVar8 == pbVar1) goto LAB_0044a7b9;
      local_60._0_8_ = local_78;
      local_60._8_8_ = local_80;
      root = detail::
             resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                       (root,(string_view_type *)local_60,create_if_missing,ec);
    } while (ec->_M_value == 0);
  }
LAB_0044a881:
  add<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
            ();
  return;
}

Assistant:

void add(Json& root, 
             const basic_json_pointer<typename Json::char_type>& location, 
             T&& value, 
             bool create_if_missing,
             std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                current->emplace_back(std::forward<T>(value));
                current = std::addressof(current->at(current->size()-1));
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index > current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                if (index == current->size())
                {
                    current->emplace_back(std::forward<T>(value));
                    current = std::addressof(current->at(current->size()-1));
                }
                else
                {
                    auto it2 = current->insert(current->array_range().begin()+index,std::forward<T>(value));
                    current = std::addressof(*it2);
                }
            }
        }
        else if (current->is_object())
        {
            auto r = current->insert_or_assign(buffer,std::forward<T>(value));
            current = std::addressof(r.first->value());
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }